

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O3

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,NotEqualExpr *ptr)

{
  SubtreeWrapper *pSVar1;
  SubtreeWrapper *pSVar2;
  int iVar3;
  int iVar4;
  RelativeConditionalWrapper *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (**(ptr->first->super_Base)._vptr_Base)(ptr->first,this);
  pSVar1 = this->curr_wrapper;
  (**(ptr->second->super_Base)._vptr_Base)(ptr->second,this);
  pSVar2 = this->curr_wrapper;
  this_00 = (RelativeConditionalWrapper *)operator_new(0x20);
  iVar3 = (*pSVar1->_vptr_SubtreeWrapper[2])(pSVar1);
  iVar4 = (*pSVar2->_vptr_SubtreeWrapper[2])(pSVar2);
  IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
            (this_00,NE,(Expression *)CONCAT44(extraout_var,iVar3),
             (Expression *)CONCAT44(extraout_var_00,iVar4));
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(NotEqualExpr* ptr) {
    ptr->first->accept(this);
    auto first = curr_wrapper;
    ptr->second->accept(this);
    auto second = curr_wrapper;

    curr_wrapper = new IRT::RelativeConditionalWrapper(
        IRT::LogicOperatorType::NE,
        first->ToExpression(),
        second->ToExpression()
    );
}